

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O1

void __thiscall Assimp::FBX::Node::AddP70vector(Node *this,string *name,double x,double y,double z)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Node n;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Node local_90;
  
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"P","");
  paVar1 = &local_90.name.field_2;
  local_90.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_d0,local_d0 + local_c8);
  local_90.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.children.super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.properties.
  super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.force_has_children = false;
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  pcVar2 = (name->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + name->_M_string_length);
  AddProperties<std::__cxx11::string,char_const*,char_const*,char_const*,double,double,double>
            (&local_90,&local_b0,"Vector3D","Vector","",x,y,z);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,&local_90);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::~vector(&local_90.children);
  std::vector<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>::
  ~vector(&local_90.properties);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FBX::Node::AddP70vector(
    const std::string& name, double x, double y, double z
) {
    FBX::Node n("P");
    n.AddProperties(name, "Vector3D", "Vector", "", x, y, z);
    AddChild(n);
}